

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::Demangle(char *mangled,char *out,size_t out_size)

{
  void *__src;
  unsigned_long __n2;
  int status;
  size_t n;
  
  __src = (void *)__cxa_demangle(mangled,0);
  if (__src != (void *)0x0) {
    if (out_size != 0) {
      out_size = 0;
    }
    if (out_size != 0) {
      memmove(out,__src,out_size);
    }
    free(__src);
  }
  return false;
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
#if defined(GLOG_OS_WINDOWS)
#  if defined(HAVE_DBGHELP)
  // When built with incremental linking, the Windows debugger
  // library provides a more complicated `Symbol->Name` with the
  // Incremental Linking Table offset, which looks like
  // `@ILT+1105(?func@Foo@@SAXH@Z)`. However, the demangler expects
  // only the mangled symbol, `?func@Foo@@SAXH@Z`. Fortunately, the
  // mangled symbol is guaranteed not to have parentheses,
  // so we search for `(` and extract up to `)`.
  //
  // Since we may be in a signal handler here, we cannot use `std::string`.
  char buffer[1024];  // Big enough for a sane symbol.
  const char* lparen = strchr(mangled, '(');
  if (lparen) {
    // Extract the string `(?...)`
    const char* rparen = strchr(lparen, ')');
    size_t length = static_cast<size_t>(rparen - lparen) - 1;
    strncpy(buffer, lparen + 1, length);
    buffer[length] = '\0';
    mangled = buffer;
  }  // Else the symbol wasn't inside a set of parentheses
  // We use the ANSI version to ensure the string type is always `char *`.
  return UnDecorateSymbolName(mangled, out, out_size, UNDNAME_COMPLETE);
#  else
  (void)mangled;
  (void)out;
  (void)out_size;
  return false;
#  endif
#elif defined(HAVE___CXA_DEMANGLE)
  int status = -1;
  std::size_t n = 0;
  std::unique_ptr<char, decltype(&std::free)> unmangled{
      abi::__cxa_demangle(mangled, nullptr, &n, &status), &std::free};

  if (!unmangled) {
    return false;
  }

  std::copy_n(unmangled.get(), std::min(n, out_size), out);
  return status == 0;
#else
  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !state.overflowed;
#endif
}